

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

int Gia_ManMuxCompare(char **pp1,char **pp2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(*pp1,*pp2);
  iVar2 = 1;
  if (-1 < iVar1) {
    iVar2 = -(uint)(iVar1 != 0);
  }
  return iVar2;
}

Assistant:

int Gia_ManMuxCompare( char ** pp1, char ** pp2 )
{
    int Diff = strcmp( *pp1, *pp2 );
    if ( Diff < 0 )
        return 1;
    if ( Diff > 0) 
        return -1;
    return 0; 
}